

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

void elf32_makestrtab(void)

{
  unsigned_long uVar1;
  uint32_t unaff_retaddr;
  uint32_t in_stack_00000008;
  bool in_stack_00000010;
  bool be;
  uint32_t in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffdc;
  uint32_t in_stack_ffffffffffffffe4;
  uint32_t in_stack_fffffffffffffff0;
  uint32_t in_stack_fffffffffffffff8;
  
  elf32_addshdr(in_stack_ffffffffffffffe4,0,in_stack_ffffffffffffffdc,1,in_stack_ffffffffffffffd4,0,
                in_stack_fffffffffffffff0,in_stack_fffffffffffffff8,unaff_retaddr,in_stack_00000008,
                in_stack_00000010);
  elfoffset = elfstringlist.nextindex + elfoffset;
  uVar1 = align((ulong)elfoffset,2);
  elfoffset = elfoffset + (int)uVar1;
  return;
}

Assistant:

static void elf32_makestrtab(void)
/* creates .strtab */
{
  bool be = elf_endianess == _BIG_ENDIAN_;

  elf32_addshdr(elfstrtabidx,SHT_STRTAB,0,0,elfoffset,
                elfstringlist.nextindex,0,0,1,0,be);
  elfoffset += elfstringlist.nextindex;
  elfoffset += align(elfoffset,2);
}